

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20240722::container_internal::operator==(iterator *a,iterator *b)

{
  slot_type *psVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  slot_type *psVar6;
  slot_type *psVar7;
  bool bVar8;
  slot_type *psVar9;
  iterator iVar10;
  
  psVar1 = (slot_type *)a->ctrl_;
  if ((psVar1 == (slot_type *)
                 absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
       psVar1 == (slot_type *)0x0) || (-1 < (char)*(code *)psVar1)) {
    psVar2 = (slot_type *)b->ctrl_;
    if ((psVar2 != (slot_type *)
                   absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
         psVar2 != (slot_type *)0x0) && ((char)*(code *)psVar2 < '\0')) goto LAB_00324e5c;
    if (psVar1 == (slot_type *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
        psVar2 == (slot_type *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
LAB_00324e4f:
      return psVar1 == psVar2;
    }
    if ((psVar1 ==
        (slot_type *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) ==
        (psVar2 ==
        (slot_type *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>)) {
      if (psVar1 == (slot_type *)0x0 || psVar2 == (slot_type *)0x0) goto LAB_00324e4f;
      if ((psVar2 == (slot_type *)&kSooControl) == (psVar1 == (slot_type *)&kSooControl)) {
        a = (iterator *)(a->field_1).slot_;
        psVar3 = (b->field_1).slot_;
        if (psVar1 == (slot_type *)&kSooControl) {
          bVar8 = (slot_type *)a == psVar3;
        }
        else {
          psVar9 = psVar3;
          psVar6 = psVar2;
          psVar7 = (slot_type *)a;
          if (psVar2 < psVar1) {
            psVar9 = (slot_type *)a;
            psVar6 = psVar1;
            psVar7 = psVar3;
          }
          b = (iterator *)CONCAT71((int7)((ulong)psVar6 >> 8),psVar6 < psVar7);
          bVar8 = psVar7 <= psVar9 && psVar6 < psVar7;
        }
        if (bVar8) goto LAB_00324e4f;
      }
      goto LAB_00324e66;
    }
  }
  else {
    operator==();
LAB_00324e5c:
    operator==();
  }
  operator==();
LAB_00324e66:
  operator==();
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>>>
  ::AssertHashEqConsistent<google::protobuf::FieldDescriptor_const*>
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>>>
              *)a,(FieldDescriptor **)b);
  if (((value_type *)a)->first == (FieldDescriptor *)0x1) {
    iVar10 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>>>
             ::find_soo<google::protobuf::FieldDescriptor_const*>
                       ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>>>
                         *)a,(key_arg<const_google::protobuf::FieldDescriptor_*> *)b);
    return iVar10.ctrl_._0_1_;
  }
  if (((value_type *)a)->first == (FieldDescriptor *)0x0) {
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, const google::protobuf::util::MessageDifferencer::MapKeyComparator *>, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, const google::protobuf::util::MessageDifferencer::MapKeyComparator *>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, const google::protobuf::util::MessageDifferencer::MapKeyComparator *>, Hash = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, const google::protobuf::util::MessageDifferencer::MapKeyComparator *>>]"
                 );
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>_>_>
  ::prefetch_heap_block
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>_>_>
              *)a);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (ctrl_t *)((long)&hash_internal::MixingHashState::kSeed + (long)b->ctrl_);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = b->ctrl_ +
                 (SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),0) ^
                 SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),8));
  iVar10 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>>>
           ::find_non_soo<google::protobuf::FieldDescriptor_const*>
                     ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>>>
                       *)a,(key_arg<const_google::protobuf::FieldDescriptor_*> *)b,
                      SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8) ^
                      SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0));
  return iVar10.ctrl_._0_1_;
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }